

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void shunt_map_left(tgestate_t *state)

{
  byte bVar1;
  
  (state->map_position).x = (state->map_position).x + '\x01';
  get_supertiles(state);
  memmove(state->tile_buf,state->tile_buf + 1,0x197);
  memmove(state->window_buf,state->window_buf + 1,0xcbf);
  bVar1 = (state->map_position).x;
  plot_vertical_tiles_common
            (state,state->tile_buf + 0x17,state->map_buf + (6 - (ulong)((bVar1 & 3) == 0)),bVar1 - 1
             ,state->window_buf + 0x17);
  return;
}

Assistant:

void shunt_map_left(tgestate_t *state)
{
  assert(state != NULL);

  state->map_position.x++;

  get_supertiles(state);

  memmove(&state->tile_buf[0], &state->tile_buf[1], TILE_BUF_LENGTH - 1);
  memmove(&state->window_buf[0], &state->window_buf[1], WINDOW_BUF_LENGTH - 1);

  plot_rightmost_tiles(state);
}